

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::SetSlotAndCache
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyRecord *propertyRecord,PropertyIndex index,Var value,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  code *pcVar1;
  bool bVar2;
  DynamicType *pDVar3;
  DynamicTypeHandler *this_00;
  undefined4 *puVar4;
  bool local_3a;
  bool populateInlineCache;
  Var value_local;
  PropertyIndex index_local;
  PropertyRecord *propertyRecord_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  bVar2 = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
  local_3a = true;
  if (!bVar2) {
    local_3a = ProcessFixedFieldChange
                         (this,instance,propertyId,index,value,
                          (flags & PropertyOperation_NonFixedValue) != PropertyOperation_None,
                          propertyRecord);
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)index,value);
  if (local_3a == false) {
    PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
    goto LAB_0141b4ff;
  }
  pDVar3 = DynamicObject::GetDynamicType(instance);
  bVar2 = DynamicType::GetIsShared(pDVar3);
  if (!bVar2) {
    bVar2 = FixPropsOnPathTypes();
    if (bVar2) {
      pDVar3 = DynamicObject::GetDynamicType(instance);
      this_00 = DynamicType::GetTypeHandler(pDVar3);
      bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared(this_00);
      if (bVar2) goto LAB_0141b4d5;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x304,
                                "((instance->GetDynamicType()->GetIsShared()) || (FixPropsOnPathTypes() && instance->GetDynamicType()->GetTypeHandler()->GetIsOrMayBecomeShared()))"
                                ,
                                "(instance->GetDynamicType()->GetIsShared()) || (FixPropsOnPathTypes() && instance->GetDynamicType()->GetTypeHandler()->GetIsOrMayBecomeShared())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
LAB_0141b4d5:
  PropertyValueInfo::Set(info,&instance->super_RecyclableObject,index,'\x04',InlineCacheNoFlags);
LAB_0141b4ff:
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,value,possibleSideEffects);
  return;
}

Assistant:

void PathTypeHandlerBase::SetSlotAndCache(DynamicObject* instance, PropertyId propertyId, PropertyRecord const * propertyRecord, PropertyIndex index, Var value, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
#if ENABLE_FIXED_FIELDS
        // Don't populate inline cache if this handler isn't yet shared.  If we did, a new instance could
        // reach this handler without us noticing and we could fail to release the old singleton instance, which may later
        // become collectible (not referenced by anything other than this handler), thus we would leak the old singleton instance.
        bool populateInlineCache = GetIsShared() ||
            ProcessFixedFieldChange(instance, propertyId, index, value, (flags & PropertyOperation_NonFixedValue) != 0, propertyRecord);
#else
        bool populateInlineCache = true;
#endif

        SetSlotUnchecked(instance, index, value);

        if (populateInlineCache)
        {
#if ENABLE_FIXED_FIELDS
            Assert((instance->GetDynamicType()->GetIsShared()) || (FixPropsOnPathTypes() && instance->GetDynamicType()->GetTypeHandler()->GetIsOrMayBecomeShared()));
#endif
            // Can't assert the following.  With NewScObject we can jump to the type handler at the tip (where the singleton is),
            // even though we haven't yet initialized the properties all the way to the tip, and we don't want to kill
            // the singleton in that case yet.  It's basically a transient inconsistent state, but we have to live with it.
            // The user's code will never see the object in this state.
            //Assert(!instance->GetTypeHandler()->HasSingletonInstance());
            PropertyValueInfo::Set(info, instance, index);
        }
        else
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }

        SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
    }